

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O2

char * Wlc_PrsFindRange(char *pStr,int *End,int *Beg)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  
  *Beg = 0;
  *End = 0;
  pcVar3 = Wlc_PrsSkipSpaces(pStr);
  if (*pcVar3 != '[') {
    return pcVar3;
  }
  pcVar3 = Wlc_PrsSkipSpaces(pcVar3 + 1);
  if ((byte)(*pcVar3 - 0x3aU) < 0xf6) {
    return (char *)0x0;
  }
  iVar1 = atoi(pcVar3);
  *Beg = iVar1;
  *End = iVar1;
  pcVar4 = Wlc_PrsFindSymbol(pcVar3,':');
  if (pcVar4 == (char *)0x0) {
    pcVar3 = Wlc_PrsFindSymbol(pcVar3,']');
    if (pcVar3 == (char *)0x0) {
      return (char *)0x0;
    }
    iVar2 = *Beg;
  }
  else {
    pcVar3 = Wlc_PrsSkipSpaces(pcVar4 + 1);
    if ((byte)(*pcVar3 - 0x3aU) < 0xf6) {
      return (char *)0x0;
    }
    iVar2 = atoi(pcVar3);
    *Beg = iVar2;
    pcVar3 = Wlc_PrsFindSymbol(pcVar3,']');
    if (pcVar3 == (char *)0x0) {
      return (char *)0x0;
    }
    iVar1 = *End;
  }
  if (iVar1 < iVar2) {
    return (char *)0x0;
  }
  return pcVar3 + 1;
}

Assistant:

static inline char * Wlc_PrsFindRange( char * pStr, int * End, int * Beg )
{
    *End = *Beg = 0;
    pStr = Wlc_PrsSkipSpaces( pStr );
    if ( pStr[0] != '[' )
        return pStr;
    pStr = Wlc_PrsSkipSpaces( pStr+1 );
    if ( !Wlc_PrsIsDigit(pStr) )
        return NULL;
    *End = *Beg = atoi( pStr );
    if ( Wlc_PrsFindSymbol( pStr, ':' ) == NULL )
    {
        pStr = Wlc_PrsFindSymbol( pStr, ']' );
        if ( pStr == NULL )
            return NULL;
    }
    else
    {
        pStr = Wlc_PrsFindSymbol( pStr, ':' );
        pStr = Wlc_PrsSkipSpaces( pStr+1 );
        if ( !Wlc_PrsIsDigit(pStr) )
            return NULL;
        *Beg = atoi( pStr );
        pStr = Wlc_PrsFindSymbol( pStr, ']' );
        if ( pStr == NULL )
            return NULL;
    }
    if ( *End < *Beg )
        return NULL;
    assert( *End >= *Beg );
    return pStr + 1;
}